

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::remove_time_critical_pieces
          (torrent *this,vector<download_priority_t,_piece_index_t> *priority)

{
  int iVar1;
  undefined4 extraout_var;
  iterator __position;
  error_code local_50;
  
  __position._M_current =
       (this->m_time_critical_pieces).
       super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (this->m_time_critical_pieces).
         super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    if ((priority->
        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_start[((__position._M_current)->piece).m_val].m_val ==
        '\0') {
      if ((((__position._M_current)->flags).m_val & 1) != 0) {
        iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)&stack0xffffffffffffffc0);
        local_50.val_ = 0x7d;
        local_50.failed_ =
             boost::system::detail::failed_impl
                       (0x7d,&boost::system::detail::cat_holder<void>::generic_category_instance.
                              super_error_category);
        local_50.cat_ =
             &boost::system::detail::cat_holder<void>::generic_category_instance.
              super_error_category;
        alert_manager::
        emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,boost::system::error_code>
                  ((alert_manager *)CONCAT44(extraout_var,iVar1),
                   (torrent_handle *)&stack0xffffffffffffffc0,&(__position._M_current)->piece,
                   &local_50);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      }
      __position = ::std::
                   vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                   ::erase(&this->m_time_critical_pieces,__position._M_current);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void torrent::remove_time_critical_pieces(aux::vector<download_priority_t, piece_index_t> const& priority)
	{
		for (auto i = m_time_critical_pieces.begin(); i != m_time_critical_pieces.end();)
		{
			if (priority[i->piece] == dont_download)
			{
				if (i->flags & torrent_handle::alert_when_available)
				{
					// post an empty read_piece_alert to indicate it failed
					alerts().emplace_alert<read_piece_alert>(
						get_handle(), i->piece, error_code(boost::system::errc::operation_canceled, generic_category()));
				}
				i = m_time_critical_pieces.erase(i);
				continue;
			}
			++i;
		}
	}